

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O1

int __thiscall ON_String::CompareOrdinal(ON_String *this,char *other_string,bool bOrdinalIgnoreCase)

{
  int iVar1;
  char *string1;
  
  string1 = operator_cast_to_char_(this);
  iVar1 = Length(this);
  iVar1 = ON_StringCompareOrdinalUTF8(string1,iVar1,other_string,-1,bOrdinalIgnoreCase);
  return iVar1;
}

Assistant:

int ON_String::CompareOrdinal(
  const char* other_string,
  bool bOrdinalIgnoreCase
  ) const
{
  return ON_String::CompareOrdinal(
    static_cast< const char* >(*this),
    this->Length(),
    other_string,
    -1,
    bOrdinalIgnoreCase
    );
}